

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallettool.cpp
# Opt level: O0

void wallet::WalletTool::WalletShowInfo(CWallet *wallet_instance)

{
  CWallet *this;
  ostream *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  CWallet *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  CWallet *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff98;
  CWallet *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,(char *)in_RDI,in_stack_ffffffffffffff8c,
             SUB41((uint)in_stack_ffffffffffffff88 >> 0x18,0));
  tinyformat::format<>
            ((ostream *)in_stack_ffffffffffffff78,
             (char *)CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(in_stack_ffffffffffffff76,
                                       CONCAT15(in_stack_ffffffffffffff75,
                                                CONCAT14(in_stack_ffffffffffffff74,
                                                         in_stack_ffffffffffffff70)))));
  CWallet::GetName_abi_cxx11_(in_stack_ffffffffffffff68);
  tinyformat::format<std::__cxx11::string>
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80);
  this = (CWallet *)CWallet::GetDatabase(in_stack_ffffffffffffff78);
  (*(this->super_WalletStorage)._vptr_WalletStorage[0xd])(local_28);
  tinyformat::format<std::__cxx11::string>
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff68);
  CWallet::IsWalletFlagSet
            (this,CONCAT17(in_stack_ffffffffffffff77,
                           CONCAT16(in_stack_ffffffffffffff76,
                                    CONCAT15(in_stack_ffffffffffffff75,
                                             CONCAT14(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70)))));
  tinyformat::format<char_const*>
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (char **)in_stack_ffffffffffffff80);
  CWallet::IsCrypted(in_stack_ffffffffffffff68);
  tinyformat::format<char_const*>
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (char **)in_stack_ffffffffffffff80);
  CWallet::IsHDEnabled(in_stack_ffffffffffffffa0);
  tinyformat::format<char_const*>
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (char **)in_stack_ffffffffffffff80);
  CWallet::GetKeyPoolSize((CWallet *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  tinyformat::format<unsigned_int>
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (uint *)in_stack_ffffffffffffff80);
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::size((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
          *)in_stack_ffffffffffffff68);
  tinyformat::format<unsigned_long>
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (unsigned_long *)in_stack_ffffffffffffff80);
  std::
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
  ::size((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
          *)in_stack_ffffffffffffff68);
  tinyformat::format<unsigned_long>
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (unsigned_long *)in_stack_ffffffffffffff80);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void WalletShowInfo(CWallet* wallet_instance)
{
    LOCK(wallet_instance->cs_wallet);

    tfm::format(std::cout, "Wallet info\n===========\n");
    tfm::format(std::cout, "Name: %s\n", wallet_instance->GetName());
    tfm::format(std::cout, "Format: %s\n", wallet_instance->GetDatabase().Format());
    tfm::format(std::cout, "Descriptors: %s\n", wallet_instance->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS) ? "yes" : "no");
    tfm::format(std::cout, "Encrypted: %s\n", wallet_instance->IsCrypted() ? "yes" : "no");
    tfm::format(std::cout, "HD (hd seed available): %s\n", wallet_instance->IsHDEnabled() ? "yes" : "no");
    tfm::format(std::cout, "Keypool Size: %u\n", wallet_instance->GetKeyPoolSize());
    tfm::format(std::cout, "Transactions: %zu\n", wallet_instance->mapWallet.size());
    tfm::format(std::cout, "Address Book: %zu\n", wallet_instance->m_address_book.size());
}